

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithms.cpp
# Opt level: O2

void __thiscall QLearning::QtableLogic(QLearning *this,int nn,int depth,int breadth)

{
  int iVar1;
  ostream *poVar2;
  mapped_type *this_00;
  ulong uVar3;
  ulong uVar4;
  undefined4 in_register_00000034;
  char *this_01;
  int one_dimensional_index;
  int j_1;
  ulong uVar5;
  double dVar6;
  allocator_type local_81;
  float local_80;
  int local_7c;
  int local_78;
  value_type_conflict1 local_74;
  map<std::vector<int,_std::allocator<int>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
  *local_70;
  size_type local_68;
  vector<int,_std::allocator<int>_> key;
  vector<float,_std::allocator<float>_> value;
  
  this_01 = (char *)CONCAT44(in_register_00000034,nn);
  if (nn == 0) {
    this_01 = "size cannot be 0";
    poVar2 = std::operator<<((ostream *)&std::cerr,"size cannot be 0");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  local_80 = (float)(nn / 2);
  local_7c = nn;
  dVar6 = pow((double)nn,(double)depth);
  local_78 = (int)dVar6;
  local_68 = (size_type)breadth;
  local_70 = &this->_q_table;
  one_dimensional_index = 0;
  uVar4 = 0;
  if (0 < depth) {
    uVar4 = (ulong)(uint)depth;
  }
  uVar5 = 0;
  if (0 < breadth) {
    uVar5 = (ulong)(uint)breadth;
  }
  if (local_78 < 1) {
    local_78 = 0;
  }
  for (; one_dimensional_index != local_78; one_dimensional_index = one_dimensional_index + 1) {
    IndexFromMulti(&key,(QLearning *)this_01,one_dimensional_index,local_7c,depth);
    for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
      key.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [uVar3] = (int)((float)key.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar3] - local_80);
    }
    local_74 = 0.0;
    std::vector<float,_std::allocator<float>_>::vector(&value,local_68,&local_74,&local_81);
    for (uVar3 = 0; uVar5 != uVar3; uVar3 = uVar3 + 1) {
      iVar1 = rand();
      value.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar3] = (float)(iVar1 % 5 + 1);
    }
    this_00 = std::
              map<std::vector<int,_std::allocator<int>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
              ::operator[](local_70,&key);
    this_01 = (char *)&value;
    std::vector<float,_std::allocator<float>_>::operator=(this_00,&value);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              ((_Vector_base<float,_std::allocator<float>_> *)&value);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&key.super__Vector_base<int,_std::allocator<int>_>);
  }
  return;
}

Assistant:

void QLearning::QtableLogic(int nn, int depth, int breadth)
{

    if (nn == 0)
    {
        std::cerr << "size cannot be 0" << std::endl;
    }

    float size = nn / 2;
    int max_index = pow(nn, depth);

    for (int i = 0; i < max_index; i++)
    {
        std::vector<int> key = IndexFromMulti(i, nn, depth);
        //change the interval [0,nn) to the interval [-size,size).
        for (int j = 0; j < depth; j++)
            key[j] -= size;

        //Fill in the value
        std::vector<float> value(breadth, 0);
        for (int j = 0; j < breadth; j++)
            value[j] = (rand() % 5) + 1;

        this->_q_table[key] = value;
    }
    //return q_table;
}